

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

bool __thiscall
dap::
BasicTypeInfo<dap::optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>_>
::serialize(BasicTypeInfo<dap::optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>_>
            *this,Serializer *s,void *ptr)

{
  bool bVar1;
  void *ptr_local;
  Serializer *s_local;
  BasicTypeInfo<dap::optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>_>
  *this_local;
  
  bVar1 = Serializer::
          serialize<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>
                    (s,(optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>
                        *)ptr);
  return bVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }